

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxProjection.cpp
# Opt level: O2

double __thiscall BoxProjection::coordinateZ(BoxProjection *this,int J,int K,int L,int G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  switch(G) {
  case 0:
    dVar1 = (this->super_Parameterization).x_lb + (this->super_Parameterization).dx * (double)J;
    dVar2 = (this->super_Parameterization).y_lb + (this->super_Parameterization).dy * (double)K;
    (this->super_Parameterization).x = dVar1;
    (this->super_Parameterization).y = dVar2;
    dVar3 = (this->super_Parameterization).z_lb;
    goto LAB_0010449c;
  case 1:
    dVar2 = (this->super_Parameterization).y_lb;
    dVar1 = (this->super_Parameterization).x_ub - (double)J * (this->super_Parameterization).dx;
    (this->super_Parameterization).x = dVar1;
    (this->super_Parameterization).y = dVar2;
    dVar3 = (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
    (this->super_Parameterization).z = dVar3;
    break;
  case 2:
    dVar1 = (this->super_Parameterization).x_lb;
    (this->super_Parameterization).x = dVar1;
    dVar2 = (this->super_Parameterization).y_lb;
    dVar4 = (this->super_Parameterization).dy * (double)J;
    dVar5 = (this->super_Parameterization).dz * (double)K;
    dVar3 = (this->super_Parameterization).z_lb;
    goto LAB_0010451b;
  case 3:
    dVar1 = (this->super_Parameterization).dx * -(double)J + (this->super_Parameterization).x_ub;
    dVar2 = (this->super_Parameterization).dy * (double)K + (this->super_Parameterization).y_lb;
    (this->super_Parameterization).x = dVar1;
    (this->super_Parameterization).y = dVar2;
    dVar3 = (this->super_Parameterization).z_ub;
LAB_0010449c:
    (this->super_Parameterization).z = dVar3;
    break;
  case 4:
    dVar1 = (double)J * (this->super_Parameterization).dx + (this->super_Parameterization).x_lb;
    (this->super_Parameterization).x = dVar1;
    dVar2 = (this->super_Parameterization).y_ub;
    (this->super_Parameterization).y = dVar2;
    dVar3 = (double)K * (this->super_Parameterization).dz + (this->super_Parameterization).z_lb;
    (this->super_Parameterization).z = dVar3;
    break;
  case 5:
    dVar1 = (this->super_Parameterization).x_ub;
    (this->super_Parameterization).x = dVar1;
    dVar4 = (this->super_Parameterization).y_ub;
    dVar5 = (this->super_Parameterization).z_lb;
    dVar2 = (this->super_Parameterization).dy * -(double)J;
    dVar3 = (this->super_Parameterization).dz * (double)K;
LAB_0010451b:
    dVar2 = dVar2 + dVar4;
    dVar3 = dVar3 + dVar5;
    (this->super_Parameterization).y = dVar2;
    (this->super_Parameterization).z = dVar3;
    break;
  default:
    dVar3 = (this->super_Parameterization).z;
    dVar1 = (this->super_Parameterization).x;
    dVar2 = (this->super_Parameterization).y;
  }
  return ((this->super_Parameterization).radius /
         SQRT(dVar3 * dVar3 + dVar1 * dVar1 + dVar2 * dVar2)) * dVar3;
}

Assistant:

double BoxProjection::coordinateZ(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Lower z
      x = x_lb + (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_lb;
      break;
    case 1:  // Lower y
      x = x_ub - (double)J * dx;
      y = y_lb;
      z = z_lb + (double)K * dz;
      break;
    case 2:  // Lower x
      x = x_lb;
      y = y_lb + (double)J * dy;
      z = z_lb + (double)K * dz;
      break;
    case 3:  // Upper z
      x = x_ub - (double)J * dx;
      y = y_lb + (double)K * dy;
      z = z_ub;
      break;
    case 4:  // Upper y
      x = x_lb + (double)J * dx;
      y = y_ub;
      z = z_lb + (double)K * dz;
      break;
    case 5:  // Upper x
      x = x_ub;
      y = y_ub - (double)J * dy;
      z = z_lb + (double)K * dz;
      break;
  }

  return z * projection(x, y, z);
}